

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcElement::IfcElement(IfcElement *this)

{
  *(undefined ***)&this->field_0x138 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x140 = 0;
  *(char **)&this->field_0x148 = "IfcElement";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__0083fcf0);
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x83fc10;
  *(undefined8 *)&this->field_0x138 = 0x83fcd8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x83fc38;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x83fc60;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x83fc88;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x83fcb0;
  *(undefined1 **)&(this->super_IfcProduct).field_0x110 = &this->field_0x120;
  *(undefined8 *)&this->field_0x118 = 0;
  this->field_0x120 = 0;
  this->field_0x130 = 0;
  return;
}

Assistant:

IfcElement() : Object("IfcElement") {}